

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O2

string * vkt::shaderexecutor::anon_unknown_0::generatePassthroughFragmentShader
                   (string *__return_storage_ptr__,ShaderSpec *shaderSpec,bool useIntOutputs,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *outLocationMap,string *inputPrefix,string *outputPrefix)

{
  pointer __rhs;
  int vecSize;
  DataType DVar1;
  ostream *poVar2;
  VarType *varType_;
  string *outputPrefix_00;
  int iVar3;
  VarType intType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  DeclareVariable local_1e8;
  ostringstream src;
  
  outputPrefix_00 = inputPrefix;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  std::operator<<((ostream *)&src,"#version 310 es\n");
  if ((shaderSpec->globalDeclarations)._M_string_length != 0) {
    poVar2 = std::operator<<((ostream *)&src,(string *)&shaderSpec->globalDeclarations);
    std::operator<<(poVar2,"\n");
  }
  iVar3 = 0;
  for (varType_ = &((shaderSpec->outputs).
                    super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                    ._M_impl.super__Vector_impl_data._M_start)->varType;
      __rhs = (pointer)((long)&varType_[-2].m_data + 8),
      __rhs != (shaderSpec->outputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish; varType_ = (VarType *)&varType_[2].m_data
      ) {
    DVar1 = (varType_->m_data).basic.type;
    if (DVar1 - TYPE_BOOL < 4) {
      vecSize = glu::getDataTypeScalarSize(DVar1);
      DVar1 = TYPE_INT;
      if (1 < vecSize) {
        DVar1 = glu::getDataTypeIntVec(vecSize);
      }
      glu::VarType::VarType(&intType,DVar1,PRECISION_HIGHP);
      poVar2 = std::operator<<((ostream *)&src,"layout(location = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
      poVar2 = std::operator<<(poVar2,") flat in ");
      std::operator+(&local_208,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     outLocationMap,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      glu::decl::DeclareVariable::DeclareVariable(&local_1e8,&intType,&local_208,0);
      poVar2 = glu::decl::operator<<(poVar2,&local_1e8);
      std::operator<<(poVar2,";\n");
      glu::decl::DeclareVariable::~DeclareVariable(&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      glu::VarType::~VarType(&intType);
    }
    else {
      poVar2 = std::operator<<((ostream *)&src,"layout(location = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
      poVar2 = std::operator<<(poVar2,") flat in ");
      std::operator+(&local_208,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     outLocationMap,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      glu::decl::DeclareVariable::DeclareVariable(&local_1e8,varType_,&local_208,0);
      poVar2 = glu::decl::operator<<(poVar2,&local_1e8);
      std::operator<<(poVar2,";\n");
      glu::decl::DeclareVariable::~DeclareVariable(&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
    }
    iVar3 = iVar3 + 1;
  }
  generateFragShaderOutputDecl
            ((ostream *)&src,shaderSpec,useIntOutputs,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)inputPrefix,outputPrefix_00);
  std::operator<<((ostream *)&src,"\nvoid main (void)\n{\n");
  generateFragShaderOutAssign
            ((ostream *)&src,shaderSpec,SUB81(outLocationMap,0),inputPrefix,outputPrefix_00);
  std::operator<<((ostream *)&src,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  return __return_storage_ptr__;
}

Assistant:

static std::string generatePassthroughFragmentShader (const ShaderSpec& shaderSpec, bool useIntOutputs, const std::map<std::string, int>& outLocationMap, const std::string& inputPrefix, const std::string& outputPrefix)
{
	std::ostringstream	src;

	src <<	"#version 310 es\n";

	if (!shaderSpec.globalDeclarations.empty())
		src << shaderSpec.globalDeclarations << "\n";

	int locationNumber = 0;
	for (vector<Symbol>::const_iterator output = shaderSpec.outputs.begin(); output != shaderSpec.outputs.end(); ++output, ++locationNumber)
	{
		if (glu::isDataTypeBoolOrBVec(output->varType.getBasicType()))
		{
			const int				vecSize		= glu::getDataTypeScalarSize(output->varType.getBasicType());
			const glu::DataType		intBaseType	= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::VarType		intType		(intBaseType, glu::PRECISION_HIGHP);

			src << "layout(location = " << locationNumber << ") flat in " << glu::declare(intType, inputPrefix + output->name) << ";\n";
		}
		else
			src << "layout(location = " << locationNumber << ") flat in " << glu::declare(output->varType, inputPrefix + output->name) << ";\n";
	}

	generateFragShaderOutputDecl(src, shaderSpec, useIntOutputs, outLocationMap, outputPrefix);

	src << "\nvoid main (void)\n{\n";

	generateFragShaderOutAssign(src, shaderSpec, useIntOutputs, inputPrefix, outputPrefix);

	src << "}\n";

	return src.str();
}